

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.hpp
# Opt level: O0

UVec3 __thiscall vkt::pipeline::TestTexture3D::getTextureDimension(TestTexture3D *this)

{
  uint x_;
  uint y_;
  uint z_;
  uint extraout_EDX;
  long in_RSI;
  UVec3 UVar1;
  TestTexture3D *this_local;
  
  x_ = tcu::Texture3D::getWidth((Texture3D *)(in_RSI + 0x20));
  y_ = tcu::Texture3D::getHeight((Texture3D *)(in_RSI + 0x20));
  z_ = tcu::Texture3D::getDepth((Texture3D *)(in_RSI + 0x20));
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,x_,y_,z_);
  UVar1.m_data[2] = extraout_EDX;
  UVar1.m_data._0_8_ = this;
  return (UVec3)UVar1.m_data;
}

Assistant:

virtual tcu::UVec3							getTextureDimension	(void) const { return tcu::UVec3(m_texture.getWidth(), m_texture.getHeight(), m_texture.getDepth()); }